

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1fc7f::AppImpl::immediatePanic(AppImpl *this)

{
  __shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  puts("panic!");
  if ((this->m_preservedStateOnPanic).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    (*((this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_AppState[7])();
    std::__shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_preservedStateOnPanic).
                super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>,
               &(this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>);
    MakeState_Panic();
    std::__shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    (*((this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_AppState[3])();
  }
  return;
}

Assistant:

void immediatePanic()
    {
        puts("panic!");
        if (m_preservedStateOnPanic)
        {
            // error: panicking while we are in panic?
            return;
        }
        m_state->deactivate();
        m_preservedStateOnPanic = m_state;
        m_state = MakeState_Panic();
        m_state->activate();
    }